

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Type_get_contents
              (MPIABI_Datatype datatype,int max_integers,int max_addresses,int max_datatypes,
              int *array_of_integers,MPIABI_Aint *array_of_addresses,
              MPIABI_Datatype *array_of_datatypes)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  WPI_Handle<ompi_datatype_t_*> local_48 [2];
  MPIABI_Datatype *pMStack_38;
  int ierr;
  MPI_Datatype *types;
  MPIABI_Aint *array_of_addresses_local;
  int *array_of_integers_local;
  int local_18;
  int max_datatypes_local;
  int max_addresses_local;
  int max_integers_local;
  MPIABI_Datatype datatype_local;
  
  pMStack_38 = array_of_datatypes;
  types = (MPI_Datatype *)array_of_addresses;
  array_of_addresses_local = (MPIABI_Aint *)array_of_integers;
  array_of_integers_local._4_4_ = max_datatypes;
  local_18 = max_addresses;
  max_datatypes_local = max_integers;
  _max_addresses_local = datatype;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(local_48,datatype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)local_48);
  iVar1 = MPI_Type_get_contents
                    (poVar2,max_datatypes_local,local_18,array_of_integers_local._4_4_,
                     array_of_addresses_local,types,pMStack_38);
  return iVar1;
}

Assistant:

int MPIABI_Type_get_contents(MPIABI_Datatype datatype,
                                        int max_integers, int max_addresses,
                                        int max_datatypes,
                                        int array_of_integers[],
                                        MPIABI_Aint array_of_addresses[],
                                        MPIABI_Datatype array_of_datatypes[]) {
  MPI_Datatype *const types = (MPI_Datatype *)(void *)array_of_datatypes;
  const int ierr = MPI_Type_get_contents(
      (WPI_Datatype)datatype, max_integers, max_addresses, max_datatypes,
      array_of_integers, (MPI_Aint *)array_of_addresses, types);
  if (sizeof(MPI_Datatype) != sizeof(MPIABI_Datatype))
    for (int i = max_datatypes - 1; i >= 0; --i)
      array_of_datatypes[i] = (WPI_Datatype)types[i];
  return ierr;
}